

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O2

int dump(Options *opts,string *name)

{
  ostream *poVar1;
  istream *piVar2;
  RiceCompressionHeader RVar3;
  tm *__tp;
  size_t sVar4;
  _Base_ptr p_Var5;
  string *this;
  ImageStructureHeader IVar6;
  TimeStampHeader TVar7;
  PrimaryHeader h;
  string line;
  timespec ts;
  undefined1 local_260 [16];
  Options *local_250;
  string type;
  File file;
  
  local_250 = opts;
  lrit::File::File(&file,name);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)name);
  poVar1 = std::operator<<(poVar1,":");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var5 = file.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &file.m_._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    switch(p_Var5[1]._M_color) {
    case _S_red:
      lrit::File::getHeader<lrit::PrimaryHeader>(&h,&file);
      poVar1 = std::operator<<((ostream *)&std::cout,"Primary (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
      poVar1 = std::operator<<(poVar1,"):");
      std::endl<char,std::char_traits<char>>(poVar1);
      type._M_dataplus._M_p = (pointer)&type.field_2;
      type._M_string_length = 0;
      type.field_2._M_allocated_capacity._0_2_ = type.field_2._M_allocated_capacity._0_2_ & 0xff00;
      std::__cxx11::string::assign((char *)&type);
      poVar1 = std::operator<<((ostream *)&std::cout,"  File type: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)h.fileType);
      poVar1 = std::operator<<(poVar1," (");
      poVar1 = std::operator<<(poVar1,(string *)&type);
      poVar1 = std::operator<<(poVar1,")");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Header header length (bits/bytes): ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,"/");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Data length (bits/bytes): ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,"/");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Total length (bits/bytes): ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,"/");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      this = &type;
      goto LAB_0011d2b7;
    case _S_black:
      IVar6 = lrit::File::getHeader<lrit::ImageStructureHeader>(&file);
      poVar1 = std::operator<<((ostream *)&std::cout,"Image structure (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
      poVar1 = std::operator<<(poVar1,"):");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Bits per pixel: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,IVar6._4_4_ & 0xff);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Columns: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,IVar6.columns);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Lines: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,IVar6.lines);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Compression: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,IVar6._8_4_ >> 0x10 & 0xff);
      std::endl<char,std::char_traits<char>>(poVar1);
      break;
    case 2:
      lrit::File::getHeader<lrit::ImageNavigationHeader>((ImageNavigationHeader *)&type,&file);
      poVar1 = std::operator<<((ostream *)&std::cout,"Image navigation (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
      poVar1 = std::operator<<(poVar1,"):");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Projection name: ");
      poVar1 = std::operator<<(poVar1,(string *)&type._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Column scaling: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Line scaling: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Column offset: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Line offset: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      goto LAB_0011d2b2;
    case 3:
      lrit::File::getHeader<lrit::ImageDataFunctionHeader>((ImageDataFunctionHeader *)&h,&file);
      poVar1 = std::operator<<((ostream *)&std::cout,"Image data function (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,3);
      poVar1 = std::operator<<(poVar1,"):");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"  Data: ");
      if (local_250->verbose == true) {
        ts.tv_sec = (__time_t)local_260;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ts,h._8_8_,h.dataLength);
        std::__cxx11::istringstream::istringstream((istringstream *)&type,(string *)&ts,_S_in);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length._0_4_ = 0;
        line._M_string_length._4_4_ = 0;
        line.field_2._M_local_buf[0] = '\0';
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&type,(string *)&line,'\n'),
              ((&piVar2->field_0x20)[(long)piVar2->_vptr_basic_istream[-3]] & 5) == 0) {
          poVar1 = std::operator<<((ostream *)&std::cout,"    ");
          poVar1 = std::operator<<(poVar1,(string *)&line);
          std::endl<char,std::char_traits<char>>(poVar1);
        }
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::istringstream::~istringstream((istringstream *)&type);
        std::__cxx11::string::~string((string *)&ts);
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cout,"(omitted, length: ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,")");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&h.totalHeaderLength
                );
      break;
    case 4:
      lrit::File::getHeader<lrit::AnnotationHeader>((AnnotationHeader *)&type,&file);
      poVar1 = std::operator<<((ostream *)&std::cout,"Annotation (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,4);
      poVar1 = std::operator<<(poVar1,"):");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Text: ");
      poVar1 = std::operator<<(poVar1,(string *)&type._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar1);
      goto LAB_0011d2b2;
    case 5:
      TVar7 = lrit::File::getHeader<lrit::TimeStampHeader>(&file);
      line._M_dataplus._M_p = TVar7._0_8_;
      line._M_string_length._0_4_ = TVar7._8_4_;
      ts = lrit::TimeStampHeader::getUnix((TimeStampHeader *)&line);
      __tp = gmtime(&ts.tv_sec);
      sVar4 = strftime((char *)&type,0x80,"%Y-%m-%d %H:%M:%S",__tp);
      poVar1 = std::operator<<((ostream *)&std::cout,"Time stamp (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,5);
      poVar1 = std::operator<<(poVar1,"):");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Time stamp: ");
      h._0_8_ = &h.dataLength;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&h,&type,(long)&type._M_dataplus._M_p + sVar4);
      poVar1 = std::operator<<(poVar1,(string *)&h);
      std::endl<char,std::char_traits<char>>(poVar1);
      this = (string *)&h;
      goto LAB_0011d2b7;
    case 6:
      lrit::File::getHeader<lrit::AncillaryTextHeader>((AncillaryTextHeader *)&type,&file);
      poVar1 = std::operator<<((ostream *)&std::cout,"Ancillary text (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,6);
      poVar1 = std::operator<<(poVar1,"):");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"  Text: ");
      poVar1 = std::operator<<(poVar1,(string *)&type._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar1);
LAB_0011d2b2:
      this = (string *)&type._M_string_length;
LAB_0011d2b7:
      std::__cxx11::string::~string((string *)this);
      break;
    default:
      switch(p_Var5[1]._M_color) {
      case 0x80:
        lrit::File::getHeader<lrit::SegmentIdentificationHeader>
                  ((SegmentIdentificationHeader *)&type,&file);
        poVar1 = std::operator<<((ostream *)&std::cout,"Segment identification (");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x80);
        poVar1 = std::operator<<(poVar1,"):");
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Image identifier: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,type._M_dataplus._M_p._4_2_);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Segment number: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,type._M_dataplus._M_p._6_2_);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Start column of segment: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)type._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Start line of segment: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,type._M_string_length._2_2_);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Number of segments: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,type._M_string_length._4_2_);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Width of final image: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,type._M_string_length._6_2_);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Height of final image: ");
        poVar1 = (ostream *)
                 std::ostream::operator<<(poVar1,type.field_2._M_allocated_capacity._0_2_);
        std::endl<char,std::char_traits<char>>(poVar1);
        break;
      case 0x81:
        h._0_16_ = lrit::File::getHeader<lrit::NOAALRITHeader>(&file);
        poVar1 = std::operator<<((ostream *)&std::cout,"NOAA LRIT (");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x81);
        poVar1 = std::operator<<(poVar1,"):");
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Agency signature: ");
        std::__cxx11::string::string((string *)&type,(char *)&h.fileType,(allocator *)&ts);
        poVar1 = std::operator<<(poVar1,(string *)&type);
        std::endl<char,std::char_traits<char>>(poVar1);
        std::__cxx11::string::~string((string *)&type);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Product ID: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)h.totalHeaderLength);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Product SubID: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,h.totalHeaderLength._2_2_);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Parameter: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,h._12_2_);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  NOAA-specific compression: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)h._14_1_);
        std::endl<char,std::char_traits<char>>(poVar1);
        break;
      case 0x82:
        break;
      case 0x83:
        RVar3 = lrit::File::getHeader<lrit::RiceCompressionHeader>(&file);
        poVar1 = std::operator<<((ostream *)&std::cout,"Rice compression (");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x83);
        poVar1 = std::operator<<(poVar1,"):");
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Flags: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,RVar3.flags);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Pixels per block: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,RVar3._6_2_ & 0xff);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  Scan lines per packet: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)RVar3.scanLinesPerPacket);
        std::endl<char,std::char_traits<char>>(poVar1);
        break;
      case 0x84:
        lrit::File::getHeader<lrit::DCSFileNameHeader>((DCSFileNameHeader *)&type,&file);
        poVar1 = std::operator<<((ostream *)&std::cout,"DCS file name (");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x84);
        poVar1 = std::operator<<(poVar1,"):");
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"  File name: ");
        poVar1 = std::operator<<(poVar1,(string *)&type._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar1);
        goto LAB_0011d2b2;
      default:
        poVar1 = std::operator<<((ostream *)&std::cerr,"Header ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var5[1]._M_color);
        poVar1 = std::operator<<(poVar1," not handled...");
        std::endl<char,std::char_traits<char>>(poVar1);
        goto LAB_0011d366;
      }
    }
  }
LAB_0011d366:
  lrit::File::~File(&file);
  return (int)((_Rb_tree_header *)p_Var5 != &file.m_._M_t._M_impl.super__Rb_tree_header);
}

Assistant:

int dump(const Options& opts, const std::string& name) {
  auto file = lrit::File(name);
  std::cout << name << ":" << std::endl;
  for (const auto& it : file.getHeaderMap()) {
    if (it.first == lrit::PrimaryHeader::CODE) {
      auto h = file.getHeader<lrit::PrimaryHeader>();
      std::cout << "Primary (" << decltype(h)::CODE << "):" << std::endl;

      std::string type;
      switch (h.fileType) {
      case 0:
        type = "Image Data";
        break;
      case 1:
        type = "Service Message";
        break;
      case 2:
        type = "Alphanumeric Text";
        break;
      case 3:
        type = "Meteorological Data";
        break;
      case 4:
        type = "GTS Messages";
        break;
      default:
        type = "unknown";
        break;
      }

      std::cout << "  File type: "
                << int(h.fileType)
                << " (" << type << ")"
                << std::endl;

      // LRIT value is in bytes
      auto headerBits = h.totalHeaderLength * 8;
      auto headerBytes = h.totalHeaderLength;
      std::cout << "  Header header length (bits/bytes): "
                << headerBits
                << "/"
                << headerBytes
                << std::endl;

      // LRIT value is in bits
      auto dataBits = h.dataLength;
      auto dataBytes = h.dataLength / 8;
      std::cout << "  Data length (bits/bytes): "
                << dataBits
                << "/"
                << dataBytes
                << std::endl;

      std::cout << "  Total length (bits/bytes): "
                << (headerBits + dataBits)
                << "/"
                << (headerBytes + dataBytes)
                << std::endl;
    } else if (it.first == lrit::ImageStructureHeader::CODE) {
      auto h = file.getHeader<lrit::ImageStructureHeader>();
      std::cout << "Image structure (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Bits per pixel: "
                << int(h.bitsPerPixel) << std::endl;
      std::cout << "  Columns: "
                << h.columns << std::endl;
      std::cout << "  Lines: "
                << h.lines << std::endl;
      std::cout << "  Compression: "
                << int(h.compression) << std::endl;
    } else if (it.first == lrit::ImageNavigationHeader::CODE) {
      auto h = file.getHeader<lrit::ImageNavigationHeader>();
      std::cout << "Image navigation (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Projection name: "
                << h.projectionName << std::endl;
      std::cout << "  Column scaling: "
                << h.columnScaling << std::endl;
      std::cout << "  Line scaling: "
                << h.lineScaling << std::endl;
      std::cout << "  Column offset: "
                << h.columnOffset << std::endl;
      std::cout << "  Line offset: "
                << h.lineOffset << std::endl;
    } else if (it.first == lrit::ImageDataFunctionHeader::CODE) {
      auto h = file.getHeader<lrit::ImageDataFunctionHeader>();
      std::cout << "Image data function (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Data: ";
      if (opts.verbose) {
        const auto str = std::string((const char*) h.data.data(), h.data.size());
        std::istringstream iss(str);
        std::string line;
        std::cout << std::endl;
        while (std::getline(iss, line, '\n')) {
          std::cout << "    " << line << std::endl;
        }
      } else {
        std::cout << "(omitted, length: " << h.data.size() << ")" << std::endl;
      }
    } else if (it.first == lrit::AnnotationHeader::CODE) {
      auto h = file.getHeader<lrit::AnnotationHeader>();
      std::cout << "Annotation (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Text: "
                << h.text << std::endl;
    } else if (it.first == lrit::TimeStampHeader::CODE) {
      std::array<char, 128> tsbuf;
      auto h = file.getHeader<lrit::TimeStampHeader>();
      auto ts = h.getUnix();
      auto len = strftime(
        tsbuf.data(),
        tsbuf.size(),
        "%Y-%m-%d %H:%M:%S",
        gmtime(&ts.tv_sec));
      std::cout << "Time stamp (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Time stamp: "
                << std::string(tsbuf.data(), len) << std::endl;
    } else if (it.first == lrit::AncillaryTextHeader::CODE) {
      auto h = file.getHeader<lrit::AncillaryTextHeader>();
      std::cout << "Ancillary text (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Text: "
                << h.text << std::endl;
    } else if (it.first == lrit::SegmentIdentificationHeader::CODE) {
      auto h = file.getHeader<lrit::SegmentIdentificationHeader>();
      std::cout << "Segment identification (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Image identifier: "
                << h.imageIdentifier << std::endl;
      std::cout << "  Segment number: "
                << h.segmentNumber << std::endl;
      std::cout << "  Start column of segment: "
                << h.segmentStartColumn << std::endl;
      std::cout << "  Start line of segment: "
                << h.segmentStartLine << std::endl;
      std::cout << "  Number of segments: "
                << h.maxSegment << std::endl;
      std::cout << "  Width of final image: "
                << h.maxColumn << std::endl;
      std::cout << "  Height of final image: "
                << h.maxLine << std::endl;
    } else if (it.first == lrit::NOAALRITHeader::CODE) {
      auto h = file.getHeader<lrit::NOAALRITHeader>();
      std::cout << "NOAA LRIT (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Agency signature: "
                << std::string(h.agencySignature) << std::endl;
      std::cout << "  Product ID: "
                << h.productID << std::endl;
      std::cout << "  Product SubID: "
                << h.productSubID << std::endl;
      std::cout << "  Parameter: "
                << h.parameter << std::endl;
      std::cout << "  NOAA-specific compression: "
                << int(h.noaaSpecificCompression) << std::endl;
    } else if (it.first == lrit::HeaderStructureRecordHeader::CODE) {
      // Ignore...
    } else if (it.first == lrit::RiceCompressionHeader::CODE) {
      auto h = file.getHeader<lrit::RiceCompressionHeader>();
      std::cout << "Rice compression (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Flags: "
                << h.flags << std::endl;
      std::cout << "  Pixels per block: "
                << int(h.pixelsPerBlock) << std::endl;
      std::cout << "  Scan lines per packet: "
                << int(h.scanLinesPerPacket) << std::endl;
    } else if (it.first == lrit::DCSFileNameHeader::CODE) {
      auto h = file.getHeader<lrit::DCSFileNameHeader>();
      std::cout << "DCS file name (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  File name: " << h.fileName << std::endl;

    } else {
      std::cerr << "Header " << it.first << " not handled..." << std::endl;
      return 1;
    }
  }
  return 0;
}